

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

uint __thiscall lzham::symbol_codec::get_bits(symbol_codec *this,uint num_bits)

{
  byte *pbVar1;
  int in_ESI;
  long in_RDI;
  uint result;
  uint c;
  uint local_18;
  uint local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    while (*(int *)(in_RDI + 0x48) < in_ESI) {
      local_18 = 0;
      if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
        if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
          (**(code **)(in_RDI + 0x30))
                    (*(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x38)
                     ,in_RDI + 8,in_RDI + 0x20,in_RDI + 0x28);
          *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x20);
          *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 8);
          if (*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) {
            pbVar1 = *(byte **)(in_RDI + 0x10);
            *(byte **)(in_RDI + 0x10) = pbVar1 + 1;
            local_18 = (uint)*pbVar1;
          }
        }
      }
      else {
        pbVar1 = *(byte **)(in_RDI + 0x10);
        *(byte **)(in_RDI + 0x10) = pbVar1 + 1;
        local_18 = (uint)*pbVar1;
      }
      *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 8;
      *(ulong *)(in_RDI + 0x40) =
           (ulong)local_18 << (0x40U - (char)*(undefined4 *)(in_RDI + 0x48) & 0x3f) |
           *(ulong *)(in_RDI + 0x40);
    }
    local_4 = (uint)(*(ulong *)(in_RDI + 0x40) >> (0x40 - (byte)in_ESI & 0x3f));
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) << ((byte)in_ESI & 0x3f);
    *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) - in_ESI;
  }
  return local_4;
}

Assistant:

uint symbol_codec::get_bits(uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);

      if (!num_bits)
         return 0;

      while (m_bit_count < (int)num_bits)
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         LZHAM_ASSERT(m_bit_count <= cBitBufSize);

         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      uint result = static_cast<uint>(m_bit_buf >> (cBitBufSize - num_bits));

      m_bit_buf <<= num_bits;
      m_bit_count -= num_bits;

      return result;
   }